

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# specreaderimpl.cpp
# Opt level: O3

void __thiscall
apngasm::spec::priv::AbstractSpecReaderImpl::AbstractSpecReaderImpl(AbstractSpecReaderImpl *this)

{
  (this->super_ISpecReaderImpl)._vptr_ISpecReaderImpl =
       (_func_int **)&PTR__AbstractSpecReaderImpl_0017f200;
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->_name,"");
  this->_loops = 0;
  this->_skipFirst = false;
  (this->_frameInfos).
  super__Vector_base<apngasm::spec::priv::FrameInfo,_std::allocator<apngasm::spec::priv::FrameInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_frameInfos).
  super__Vector_base<apngasm::spec::priv::FrameInfo,_std::allocator<apngasm::spec::priv::FrameInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_frameInfos).
  super__Vector_base<apngasm::spec::priv::FrameInfo,_std::allocator<apngasm::spec::priv::FrameInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

AbstractSpecReaderImpl::AbstractSpecReaderImpl()
        : _name("")
        , _loops(0)
        , _skipFirst(false)
        , _frameInfos()
      {
        // nop
      }